

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strongly_connected_components.h
# Opt level: O3

bool __thiscall wasm::SCCs<IntIt,_GraphSCCs>::stepToNextGroup(SCCs<IntIt,_GraphSCCs> *this)

{
  unordered_map<unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>_>
  *this_00;
  pointer *ppWVar1;
  iterator __position;
  undefined8 uVar2;
  vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
  *pvVar3;
  pointer pWVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  IntIt it;
  key_type kVar8;
  ulong uVar9;
  ulong uVar10;
  __hashtable *__h;
  iterator __position_00;
  bool bVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false,_false>,_bool>
  pVar12;
  WorkItem local_60;
  size_type local_50;
  undefined1 local_48;
  vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
  *local_40;
  bool local_31;
  
  iVar7._M_current =
       (this->workStack).
       super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
       ._M_impl.super__Vector_impl_data._M_start;
  __position_00._M_current =
       (this->workStack).
       super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  kVar8 = (this->inputIt).i;
  bVar11 = kVar8 != (this->inputEnd).i;
  local_31 = iVar7._M_current != __position_00._M_current || bVar11;
  if (iVar7._M_current != __position_00._M_current || bVar11) {
    local_40 = (vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
                *)&this->workStack;
    this_00 = &this->elementInfo;
    do {
      pvVar3 = local_40;
      uVar2 = local_60._8_8_;
      bVar11 = iVar7._M_current == __position_00._M_current;
      pWVar4 = iVar7._M_current;
      iVar7._M_current = __position_00._M_current;
      if (bVar11) {
        (this->inputIt).i = kVar8 + 1;
        local_60.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._4_4_ =
             local_60.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._4_4_ & 0xffffff00;
        local_60._13_3_ = SUB83(uVar2,5);
        local_60.processedChildren = false;
        local_60.item = kVar8;
        if (__position_00._M_current ==
            (this->workStack).
            super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<wasm::SCCs<IntIt,GraphSCCs>::WorkItem,std::allocator<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>>
          ::_M_realloc_insert<wasm::SCCs<IntIt,GraphSCCs>::WorkItem>
                    (local_40,__position_00,&local_60);
          iVar7._M_current =
               (this->workStack).
               super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          (__position_00._M_current)->item = kVar8;
          ((__position_00._M_current)->parent).super__Optional_base<unsigned_int,_true,_true>.
          _M_payload.super__Optional_payload_base<unsigned_int>._M_payload =
               local_60.parent.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          *(undefined8 *)
           &((__position_00._M_current)->parent).super__Optional_base<unsigned_int,_true,_true>.
            _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged = local_60._8_8_;
          iVar7._M_current =
               (this->workStack).
               super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
          (this->workStack).
          super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
          ._M_impl.super__Vector_impl_data._M_finish = iVar7._M_current;
        }
        pWVar4 = *(pointer *)pvVar3;
      }
      __position_00._M_current = iVar7._M_current;
      if (pWVar4 != iVar7._M_current) {
        do {
          pWVar4 = __position_00._M_current + -1;
          if (__position_00._M_current[-1].processedChildren == false) {
            local_60._8_8_ = (this->elementInfo)._M_h._M_element_count;
            local_60.item = pWVar4->item;
            local_48 = 1;
            local_50 = local_60._8_8_;
            pVar12 = std::
                     _Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,std::allocator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                     ::
                     _M_emplace<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>
                               ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>,std::allocator<std::pair<unsigned_int_const,wasm::SCCs<IntIt,GraphSCCs>::ElementInfo>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                 *)this_00,&local_60);
            if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              if (*(char *)((long)pVar12.first.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                                  ._M_cur.
                                  super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                           + 0x20) == '\x01') {
                if (__position_00._M_current[-1].parent.
                    super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_engaged == false) {
                  __assert_fail("work.parent",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/strongly_connected_components.h"
                                ,0x6e,
                                "bool wasm::SCCs<IntIt, GraphSCCs>::stepToNextGroup() [It = IntIt, Class = GraphSCCs]"
                               );
                }
                pmVar5 = std::__detail::
                         _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)this_00,(key_type *)&__position_00._M_current[-1].parent);
                uVar9 = *(ulong *)((long)pVar12.first.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                                         ._M_cur.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_false>
                                  + 0x10);
                uVar10 = pmVar5->lowlink;
                if (uVar9 < pmVar5->lowlink) {
                  uVar10 = uVar9;
                }
                pmVar5->lowlink = uVar10;
              }
              goto LAB_001c0e97;
            }
            __position._M_current =
                 (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->stack,
                         __position,&pWVar4->item);
              kVar8 = pWVar4->item;
            }
            else {
              kVar8 = pWVar4->item;
              *__position._M_current = kVar8;
              (this->stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            __position_00._M_current[-1].processedChildren = true;
            (this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int> =
                 (_Optional_payload_base<unsigned_int>)((ulong)kVar8 | 0x100000000);
            GraphSCCs::pushChildren((GraphSCCs *)this,__position_00._M_current[-1].item);
            if ((this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int>._M_engaged == true) {
              (this->currParent).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_engaged = false;
            }
          }
          else {
            pmVar5 = std::__detail::
                     _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                   *)this_00,&pWVar4->item);
            if (__position_00._M_current[-1].parent.super__Optional_base<unsigned_int,_true,_true>.
                _M_payload.super__Optional_payload_base<unsigned_int>._M_engaged == true) {
              pmVar6 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>,_std::allocator<std::pair<const_unsigned_int,_wasm::SCCs<IntIt,_GraphSCCs>::ElementInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,(key_type *)&__position_00._M_current[-1].parent);
              uVar9 = pmVar6->lowlink;
              if (pmVar5->lowlink < pmVar6->lowlink) {
                uVar9 = pmVar5->lowlink;
              }
              pmVar6->lowlink = uVar9;
            }
            if (pmVar5->index == pmVar5->lowlink) {
              (this->currRoot).super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> =
                   (_Optional_payload_base<unsigned_int>)((ulong)pWVar4->item | 0x100000000);
              ppWVar1 = &(this->workStack).
                         super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppWVar1 = *ppWVar1 + -1;
              goto LAB_001c0f2c;
            }
LAB_001c0e97:
            ppWVar1 = &(this->workStack).
                       super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppWVar1 = *ppWVar1 + -1;
          }
          iVar7._M_current =
               (this->workStack).
               super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_start;
          __position_00._M_current =
               (this->workStack).
               super__Vector_base<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem,_std::allocator<wasm::SCCs<IntIt,_GraphSCCs>::WorkItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
        } while (iVar7._M_current != __position_00._M_current);
      }
      kVar8 = (this->inputIt).i;
      local_31 = iVar7._M_current != __position_00._M_current || kVar8 != (this->inputEnd).i;
    } while (local_31);
  }
LAB_001c0f2c:
  return (bool)(local_31 & 1);
}

Assistant:

bool stepToNextGroup() {
    while (inputIt != inputEnd || !workStack.empty()) {
      if (workStack.empty()) {
        workStack.push_back({*inputIt++});
      }
      while (!workStack.empty()) {
        auto& work = workStack.back();
        auto& item = work.item;

        if (!work.processedChildren) {
          auto newIndex = elementInfo.size();
          auto [it, inserted] =
            elementInfo.insert({item, {newIndex, newIndex, true}});
          if (inserted) {
            // This is a new item we have never seen before. We have already
            // initialized its associated data.
            stack.push_back(item);

            // Leave the element on the work stack because we will have to do
            // more work after we have finished processing its children.
            work.processedChildren = true;
            currParent = item;
            static_cast<Class*>(this)->pushChildren(item);
            currParent = std::nullopt;
            // Process the pushed children first; we will come back to this item
            // later.
            continue;
          }

          auto& info = it->second;
          if (info.onStack) {
            assert(work.parent);
            // Item is already in the current SCC. Update the parent's lowlink
            // if this child has a smaller index than we have seen so far.
            auto& parentLowlink = elementInfo[*work.parent].lowlink;
            parentLowlink = std::min(parentLowlink, info.index);
          } else {
            // Item is in an SCC we have already processed, so ignore it
            // entirely.
          }
          // Do not recurse for this item we have seen before. We are done with
          // it.
          workStack.pop_back();
          continue;
        }

        // We have finished processing the children for the current element, so
        // we know its final lowlink value. Use it to potentially update the
        // parent's lowlink value.
        auto& info = elementInfo[item];
        if (work.parent) {
          auto& parentLowlink = elementInfo[*work.parent].lowlink;
          parentLowlink = std::min(parentLowlink, info.lowlink);
        }

        if (info.index == info.lowlink) {
          // This element reaches and is reachable by all shallower elements in
          // the stack (otherwise they would have already been popped) and does
          // not itself reach any deeper elements, so we have found an SCC and
          // the current item is its root.
          currRoot = item;
          workStack.pop_back();
          return true;
        }
        workStack.pop_back();
      }
    }
    // We are at the end.
    return false;
  }